

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

QSslCertificate __thiscall QSslSocket::localCertificate(QSslSocket *this)

{
  long lVar1;
  bool bVar2;
  QSslCertificatePrivate *in_RDI;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  QExplicitlySharedDataPointer<QSslCertificatePrivate> this_00;
  EncodingFormat in_stack_ffffffffffffffe4;
  QByteArray *in_stack_ffffffffffffffe8;
  QSslCertificate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.d.ptr =
       (totally_ordered_wrapper<QSslCertificatePrivate_*>)
       (totally_ordered_wrapper<QSslCertificatePrivate_*>)in_RDI;
  d_func((QSslSocket *)0x3a2516);
  bVar2 = QList<QSslCertificate>::isEmpty((QList<QSslCertificate> *)0x3a2530);
  if (bVar2) {
    QByteArray::QByteArray((QByteArray *)0x3a2540);
    QSslCertificate::QSslCertificate
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
    QByteArray::~QByteArray((QByteArray *)0x3a255a);
  }
  else {
    QList<QSslCertificate>::operator[]((QList<QSslCertificate> *)this_00.d.ptr,(qsizetype)in_RDI);
    QSslCertificate::QSslCertificate((QSslCertificate *)this_00.d.ptr,(QSslCertificate *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
           (QExplicitlySharedDataPointer<QSslCertificatePrivate>)this_00.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QSslCertificate QSslSocket::localCertificate() const
{
    Q_D(const QSslSocket);
    if (d->configuration.localCertificateChain.isEmpty())
        return QSslCertificate();
    return d->configuration.localCertificateChain[0];
}